

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_stream.c
# Opt level: O2

void PaUtil_InitializeStreamInterface
               (PaUtilStreamInterface *streamInterface,_func_PaError_PaStream_ptr *Close,
               _func_PaError_PaStream_ptr *Start,_func_PaError_PaStream_ptr *Stop,
               _func_PaError_PaStream_ptr *Abort,_func_PaError_PaStream_ptr *IsStopped,
               _func_PaError_PaStream_ptr *IsActive,_func_PaTime_PaStream_ptr *GetTime,
               _func_double_PaStream_ptr *GetCpuLoad,
               _func_PaError_PaStream_ptr_void_ptr_unsigned_long *Read,
               _func_PaError_PaStream_ptr_void_ptr_unsigned_long *Write,
               _func_long_PaStream_ptr *GetReadAvailable,_func_long_PaStream_ptr *GetWriteAvailable)

{
  streamInterface->Close = Close;
  streamInterface->Start = Start;
  streamInterface->Stop = Stop;
  streamInterface->Abort = Abort;
  streamInterface->IsStopped = IsStopped;
  streamInterface->IsActive = IsActive;
  streamInterface->GetTime = GetTime;
  streamInterface->GetCpuLoad = GetCpuLoad;
  streamInterface->Read = Read;
  streamInterface->Write = Write;
  streamInterface->GetReadAvailable = GetReadAvailable;
  streamInterface->GetWriteAvailable = GetWriteAvailable;
  return;
}

Assistant:

void PaUtil_InitializeStreamInterface( PaUtilStreamInterface *streamInterface,
                                       PaError (*Close)( PaStream* ),
                                       PaError (*Start)( PaStream* ),
                                       PaError (*Stop)( PaStream* ),
                                       PaError (*Abort)( PaStream* ),
                                       PaError (*IsStopped)( PaStream* ),
                                       PaError (*IsActive)( PaStream* ),
                                       PaTime (*GetTime)( PaStream* ),
                                       double (*GetCpuLoad)( PaStream* ),
                                       PaError (*Read)( PaStream*, void *, unsigned long ),
                                       PaError (*Write)( PaStream*, const void *, unsigned long ),
                                       signed long (*GetReadAvailable)( PaStream* ),
                                       signed long (*GetWriteAvailable)( PaStream* )  )
{
    streamInterface->Close = Close;
    streamInterface->Start = Start;
    streamInterface->Stop = Stop;
    streamInterface->Abort = Abort;
    streamInterface->IsStopped = IsStopped;
    streamInterface->IsActive = IsActive;
    streamInterface->GetTime = GetTime;
    streamInterface->GetCpuLoad = GetCpuLoad;
    streamInterface->Read = Read;
    streamInterface->Write = Write;
    streamInterface->GetReadAvailable = GetReadAvailable;
    streamInterface->GetWriteAvailable = GetWriteAvailable;
}